

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O0

void aom_avg_8x8_quad_c(uint8_t *s,int p,int x16_idx,int y16_idx,int *avg)

{
  uint uVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  uint8_t *s_tmp;
  int y8_idx;
  int x8_idx;
  int k;
  undefined4 local_24;
  
  for (local_24 = 0; (int)local_24 < 4; local_24 = local_24 + 1) {
    uVar1 = aom_avg_8x8_c((uint8_t *)
                          (in_RDI + (in_ECX + ((int)local_24 >> 1) * 8) * in_ESI +
                          (long)(int)(in_EDX + (local_24 & 1) * 8)),in_ESI);
    *(uint *)(in_R8 + (long)(int)local_24 * 4) = uVar1;
  }
  return;
}

Assistant:

void aom_avg_8x8_quad_c(const uint8_t *s, int p, int x16_idx, int y16_idx,
                        int *avg) {
  for (int k = 0; k < 4; k++) {
    const int x8_idx = x16_idx + ((k & 1) << 3);
    const int y8_idx = y16_idx + ((k >> 1) << 3);
    const uint8_t *s_tmp = s + y8_idx * p + x8_idx;
    avg[k] = aom_avg_8x8_c(s_tmp, p);
  }
}